

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmCommandExists(void *arg,char *name)

{
  cmMakefile *pcVar1;
  cmState *this;
  cmCommand *pcVar2;
  allocator local_41;
  string local_40;
  void *local_20;
  cmMakefile *mf;
  char *name_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)name;
  name_local = (char *)arg;
  this = cmMakefile::GetState((cmMakefile *)arg);
  pcVar1 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,(char *)pcVar1,&local_41);
  pcVar2 = cmState::GetCommand(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (uint)(pcVar2 != (cmCommand *)0x0);
}

Assistant:

int CCONV cmCommandExists(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->GetState()->GetCommand(name) ? 1 : 0);
}